

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale.cc
# Opt level: O2

void ScalePlaneBilinearDown_16
               (int src_width,int src_height,int dst_width,int dst_height,int src_stride,
               int dst_stride,uint16_t *src_ptr,uint16_t *dst_ptr,FilterMode filtering)

{
  ulong uVar1;
  int iVar2;
  uint16_t *src_ptr_00;
  uint16_t *dst_ptr_00;
  code *pcVar3;
  uint uVar4;
  uint local_60;
  int local_5c;
  int dx;
  int x;
  int local_50;
  int local_4c;
  int dy;
  int local_44;
  void *local_40;
  ptrdiff_t local_38;
  
  x = 0;
  local_60 = 0;
  dx = 0;
  dy = 0;
  local_5c = dst_width;
  local_50 = dst_height;
  local_4c = src_stride;
  local_40 = malloc((long)(src_width * 2 + 0x3f));
  uVar4 = src_height * 0x10000 - 0x10000;
  if (src_width < 0x8000) {
    pcVar3 = ScaleFilterCols_16_C;
  }
  else {
    pcVar3 = ScaleFilterCols64_16_C;
  }
  uVar1 = (long)local_40 + 0x3f;
  ScaleSlope(src_width,src_height,local_5c,local_50,filtering,&x,(int *)&local_60,&dx,&dy);
  local_44 = -src_width;
  if (0 < src_width) {
    local_44 = src_width;
  }
  if ((int)uVar4 < (int)local_60) {
    local_60 = uVar4;
  }
  dst_ptr_00 = (uint16_t *)(uVar1 & 0xffffffffffffffc0);
  local_38 = (ptrdiff_t)local_4c;
  iVar2 = 0;
  if (0 < local_50) {
    iVar2 = local_50;
  }
  while (iVar2 != 0) {
    src_ptr_00 = src_ptr + ((int)local_60 >> 0x10) * local_4c;
    if (filtering != kFilterLinear) {
      InterpolateRow_16_C(dst_ptr_00,src_ptr_00,local_38,local_44,local_60 >> 8 & 0xff);
      src_ptr_00 = dst_ptr_00;
    }
    (*pcVar3)(dst_ptr,src_ptr_00,local_5c,x,dx);
    local_60 = local_60 + dy;
    if ((int)uVar4 <= (int)local_60) {
      local_60 = uVar4;
    }
    dst_ptr = dst_ptr + dst_stride;
    iVar2 = iVar2 + -1;
  }
  free(local_40);
  return;
}

Assistant:

void ScalePlaneBilinearDown_16(int src_width,
                               int src_height,
                               int dst_width,
                               int dst_height,
                               int src_stride,
                               int dst_stride,
                               const uint16_t* src_ptr,
                               uint16_t* dst_ptr,
                               enum FilterMode filtering) {
  // Initial source x/y coordinate and step values as 16.16 fixed point.
  int x = 0;
  int y = 0;
  int dx = 0;
  int dy = 0;
  // TODO(fbarchard): Consider not allocating row buffer for kFilterLinear.
  // Allocate a row buffer.
  align_buffer_64(row, src_width * 2);

  const int max_y = (src_height - 1) << 16;
  int j;
  void (*ScaleFilterCols)(uint16_t * dst_ptr, const uint16_t* src_ptr,
                          int dst_width, int x, int dx) =
      (src_width >= 32768) ? ScaleFilterCols64_16_C : ScaleFilterCols_16_C;
  void (*InterpolateRow)(uint16_t * dst_ptr, const uint16_t* src_ptr,
                         ptrdiff_t src_stride, int dst_width,
                         int source_y_fraction) = InterpolateRow_16_C;
  ScaleSlope(src_width, src_height, dst_width, dst_height, filtering, &x, &y,
             &dx, &dy);
  src_width = Abs(src_width);

#if defined(HAS_INTERPOLATEROW_16_SSE2)
  if (TestCpuFlag(kCpuHasSSE2)) {
    InterpolateRow = InterpolateRow_Any_16_SSE2;
    if (IS_ALIGNED(src_width, 16)) {
      InterpolateRow = InterpolateRow_16_SSE2;
    }
  }
#endif
#if defined(HAS_INTERPOLATEROW_16_SSSE3)
  if (TestCpuFlag(kCpuHasSSSE3)) {
    InterpolateRow = InterpolateRow_Any_16_SSSE3;
    if (IS_ALIGNED(src_width, 16)) {
      InterpolateRow = InterpolateRow_16_SSSE3;
    }
  }
#endif
#if defined(HAS_INTERPOLATEROW_16_AVX2)
  if (TestCpuFlag(kCpuHasAVX2)) {
    InterpolateRow = InterpolateRow_Any_16_AVX2;
    if (IS_ALIGNED(src_width, 32)) {
      InterpolateRow = InterpolateRow_16_AVX2;
    }
  }
#endif
#if defined(HAS_INTERPOLATEROW_16_NEON)
  if (TestCpuFlag(kCpuHasNEON)) {
    InterpolateRow = InterpolateRow_Any_16_NEON;
    if (IS_ALIGNED(src_width, 16)) {
      InterpolateRow = InterpolateRow_16_NEON;
    }
  }
#endif

#if defined(HAS_SCALEFILTERCOLS_16_SSSE3)
  if (TestCpuFlag(kCpuHasSSSE3) && src_width < 32768) {
    ScaleFilterCols = ScaleFilterCols_16_SSSE3;
  }
#endif
  if (y > max_y) {
    y = max_y;
  }

  for (j = 0; j < dst_height; ++j) {
    int yi = y >> 16;
    const uint16_t* src = src_ptr + yi * src_stride;
    if (filtering == kFilterLinear) {
      ScaleFilterCols(dst_ptr, src, dst_width, x, dx);
    } else {
      int yf = (y >> 8) & 255;
      InterpolateRow((uint16_t*)row, src, src_stride, src_width, yf);
      ScaleFilterCols(dst_ptr, (uint16_t*)row, dst_width, x, dx);
    }
    dst_ptr += dst_stride;
    y += dy;
    if (y > max_y) {
      y = max_y;
    }
  }
  free_aligned_buffer_64(row);
}